

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::Check
          (WavingSketch<8U,_1U,_4U> *this,HashMap<4U> *mp,count_type HIT,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  __node_base *p_Var11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double local_58;
  
  p_Var11 = &(mp->_M_h)._M_before_begin;
  local_58 = 0.0;
  iVar10 = 0;
  iVar9 = 0;
  iVar8 = 0;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    iVar4 = (*(this->super_Abstract<4U>)._vptr_Abstract[3])(this,p_Var11 + 1);
    iVar1 = *(int *)((long)(p_Var11 + 1) + 4);
    if (HIT < iVar1) {
      iVar8 = iVar8 + 1;
      iVar7 = -iVar4;
      if (0 < iVar4) {
        iVar7 = iVar4;
      }
      iVar4 = iVar7;
      if (HIT < iVar7) {
        iVar10 = iVar10 + 1;
        iVar7 = iVar1 - iVar7;
        iVar5 = -iVar7;
        if (0 < iVar7) {
          iVar5 = iVar7;
        }
        local_58 = local_58 + (double)iVar5 / (double)iVar1;
      }
    }
    iVar9 = iVar9 + (uint)(HIT < iVar4);
  }
  dVar12 = (double)iVar10;
  dVar14 = dVar12 / (double)iVar8;
  dVar13 = dVar12 / (double)iVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar13 + dVar14;
  uVar2 = vcmpsd_avx512f(auVar15,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  printf("%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",local_58 / dVar12,dVar14,
         (this->super_Abstract<4U>).name._M_dataplus._M_p);
  poVar6 = std::ostream::_M_insert<double>(local_58 / dVar12);
  std::operator<<(poVar6,",");
  poVar6 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar6,",");
  poVar6 = std::ostream::_M_insert<double>(dVar13);
  std::operator<<(poVar6,",");
  poVar6 = std::ostream::_M_insert<double>
                     (((dVar13 + dVar13) * dVar14) /
                      (double)((ulong)bVar3 * 0x3ff0000000000000 +
                              (ulong)!bVar3 * (long)(dVar13 + dVar14)));
  std::operator<<(poVar6,",");
  return;
}

Assistant:

void Check(const HashMap<DATA_LEN>& mp, count_type HIT, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		printf(
			"%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",
			this->name.c_str(), are, cr, pr, 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr));
		*outs[0] << are << ",";
		*outs[1] << cr << ",";
		*outs[2] << pr << ",";
		*outs[3] << 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr) << ",";
	}